

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qp.c
# Opt level: O0

int main(int argc,char **argv)

{
  char local_198 [8];
  char file4_tmp [24];
  char local_178 [8];
  char file4_decoded [18];
  char local_158 [8];
  char file4 [20];
  char local_138 [8];
  char file3_tmp [23];
  char local_118 [8];
  char file3_decoded [17];
  char local_f8 [8];
  char file3 [19];
  char local_d8 [8];
  char file2_tmp [22];
  char local_b8 [8];
  char file2_encoded [20];
  char local_98 [8];
  char file2 [18];
  char local_78 [8];
  char file1_tmp [21];
  char local_58 [8];
  char file1_encoded [19];
  char local_38 [8];
  char file1 [17];
  char **argv_local;
  int argc_local;
  
  builtin_strncpy(local_38,"qp_iso_p",8);
  builtin_strncpy(file1,"lain.txt",9);
  builtin_strncpy(local_58,"qp_iso_e",8);
  builtin_strncpy(file1_encoded,"ncoded.txt",0xb);
  builtin_strncpy(local_78,"qp_iso_p",8);
  builtin_strncpy(file1_tmp,"lain_tmp.txt",0xd);
  builtin_strncpy(local_98,"qp_utf8_",8);
  builtin_strncpy(file2,"plain.txt",10);
  builtin_strncpy(local_b8,"qp_utf8_",8);
  builtin_strncpy(file2_encoded,"encoded.txt",0xc);
  builtin_strncpy(local_d8,"qp_utf8_",8);
  builtin_strncpy(file2_tmp,"plain_tmp.txt",0xe);
  builtin_strncpy(local_f8,"qp_iso_e",8);
  builtin_strncpy(file3,"ncoded.txt",0xb);
  builtin_strncpy(local_118,"qp_iso_p",8);
  builtin_strncpy(file3_decoded,"lain.txt",9);
  builtin_strncpy(local_138,"qp_iso_e",8);
  builtin_strncpy(file3_tmp,"ncoded_tmp.txt",0xf);
  builtin_strncpy(local_158,"qp_utf8_",8);
  builtin_strncpy(file4,"encoded.txt",0xc);
  builtin_strncpy(local_178,"qp_utf8_",8);
  builtin_strncpy(file4_decoded,"plain.txt",10);
  builtin_strncpy(local_198,"qp_utf8_",8);
  builtin_strncpy(file4_tmp,"encoded_tmp.txt",0x10);
  validate_qp(local_38,local_78,local_58,1,1);
  validate_qp(local_98,local_d8,local_b8,1,1);
  validate_qp(local_f8,local_138,local_118,0,1);
  validate_qp(local_158,local_198,local_178,0,1);
  return 0;
}

Assistant:

int main (int argc, char const *argv[]) {
    /* validate encoding with iso input */
    char file1[] = "qp_iso_plain.txt";
    char file1_encoded[] = "qp_iso_encoded.txt";
    char file1_tmp[] = "qp_iso_plain_tmp.txt";

    /* validate encoding with utf-8 input */
    char file2[] = "qp_utf8_plain.txt";
    char file2_encoded[] ="qp_utf8_encoded.txt";
    char file2_tmp[] = "qp_utf8_plain_tmp.txt";

    /* validate decoding with iso input */
    char file3[] = "qp_iso_encoded.txt";
    char file3_decoded[] = "qp_iso_plain.txt";
    char file3_tmp[] = "qp_iso_encoded_tmp.txt";

    /* validate decoding with utf-8 input */
    char file4[] = "qp_utf8_encoded.txt";
    char file4_decoded[] = "qp_utf8_plain.txt";
    char file4_tmp[] = "qp_utf8_encoded_tmp.txt";

    /* really do something */
    validate_qp(file1,file1_tmp,file1_encoded, 1, 1);
    validate_qp(file2,file2_tmp,file2_encoded, 1, 1);
    validate_qp(file3,file3_tmp,file3_decoded, 0, 1);
    validate_qp(file4,file4_tmp,file4_decoded, 0, 1);

    return(0);
}